

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  buffer_appender<char> bVar6;
  char *__last;
  char *__first;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  iVar7 = this->num_digits_;
  iVar8 = this->exp_;
  uVar11 = iVar8 + iVar7;
  if ((this->specs_).field_0x4 == '\x01') {
    cVar1 = *this->digits_;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar4 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = cVar1;
    iVar7 = (this->specs_).precision - this->num_digits_;
    if ((1 < this->num_digits_) || (((this->specs_).field_0x6 & 0x10) != 0)) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
    }
    bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_ + 1,this->digits_ + this->num_digits_,it);
    if ((0 < iVar7) && (((this->specs_).field_0x6 & 0x10) != 0)) {
      iVar7 = iVar7 + 1;
      do {
        if (*(ulong *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        lVar4 = *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(undefined1 *)
         (*(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    bVar2 = (this->specs_).field_0x6;
    if (*(ulong *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) <
        *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
             0x10) = lVar4 + 1;
    *(byte *)(*(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = ((bVar2 & 1) == 0) << 5 | 0x45;
    bVar6 = write_exponent<char,fmt::v7::detail::buffer_appender<char>>(uVar11 - 1,bVar6);
    return (buffer_appender<char>)
           bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  if (iVar8 < 0) {
    if ((int)uVar11 < 1) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar4) = 0x30;
      iVar7 = -uVar11;
      uVar9 = (ulong)(uint)this->num_digits_;
      if (uVar9 == 0) {
        iVar8 = (this->specs_).precision;
        iVar12 = iVar7;
        if (SBORROW4(iVar8,iVar7) != (int)(iVar8 + uVar11) < 0) {
          iVar12 = iVar8;
        }
        if (-1 < iVar8) {
          iVar7 = iVar12;
        }
      }
      uVar11 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < this->num_digits_ && (char)(uVar11 >> 0x14) == '\0') {
        do {
          if (this->digits_[uVar9 - 1] != '0') goto LAB_002366f3;
          bVar5 = 1 < (long)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar5);
        uVar9 = 0;
      }
LAB_002366f3:
      if ((uVar11 != 0 || iVar7 != 0) || (int)uVar9 != 0) {
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) <
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        cVar1 = this->decimal_point_;
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 8) + lVar4) = cVar1;
        if (0 < iVar7) {
          iVar7 = iVar7 + 1;
          do {
            if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                 container + 0x18) <
                *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + 1U) {
              (*(code *)**(undefined8 **)
                          it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                        (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
            }
            lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10);
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) = lVar4 + 1;
            *(undefined1 *)
             (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = 0x30;
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
        }
        __first = this->digits_;
        __last = __first + (int)uVar9;
        goto LAB_0023676d;
      }
    }
    else {
      uVar9 = (ulong)uVar11;
      it = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                     (this->digits_,this->digits_ + uVar9,it);
      if (((this->specs_).field_0x6 & 0x10) == 0) {
        uVar3 = this->num_digits_;
        uVar10 = (ulong)uVar3;
        if ((int)uVar11 < (int)uVar3) {
          uVar10 = (ulong)(int)uVar3;
          do {
            if (this->digits_[uVar10 - 1] != '0') goto LAB_00236637;
            uVar10 = uVar10 - 1;
          } while ((long)uVar9 < (long)uVar10);
          uVar10 = (ulong)uVar11;
        }
LAB_00236637:
        if ((uint)uVar10 != uVar11) {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          cVar1 = this->decimal_point_;
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 8) + lVar4) = cVar1;
        }
        __first = this->digits_ + uVar9;
        __last = this->digits_ + (int)(uint)uVar10;
LAB_0023676d:
        bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>(__first,__last,it);
        return (buffer_appender<char>)
               bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      }
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      it = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                     (this->digits_ + uVar9,this->digits_ + this->num_digits_,it);
      iVar7 = (this->specs_).precision;
      iVar8 = this->num_digits_;
      iVar12 = iVar7 - iVar8;
      if ((iVar12 != 0 && iVar8 <= iVar7) && (iVar12 != 0 && iVar8 <= iVar7)) {
        iVar12 = iVar12 + 1;
        do {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
          iVar12 = iVar12 + -1;
        } while (1 < iVar12);
      }
    }
  }
  else {
    it = std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_,this->digits_ + iVar7,it);
    if (this->num_digits_ < (int)uVar11) {
      iVar7 = ((iVar8 + iVar7) - this->num_digits_) + 1;
      do {
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) <
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(undefined1 *)
         (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   8) + lVar4) = 0x30;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    if ((((this->specs_).field_0x6 & 0x10) != 0) || ((this->specs_).precision < 0)) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      iVar7 = (this->specs_).precision;
      iVar8 = iVar7 - uVar11;
      if (iVar8 == 0 || iVar7 < (int)uVar11) {
        if ((this->specs_).field_0x4 != '\x02') {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
        }
      }
      else {
        iVar8 = iVar8 + 1;
        do {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
    }
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }